

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printf-test.cc
# Opt level: O0

void __thiscall PrintfTest_MinusFlag_Test::TestBody(PrintfTest_MinusFlag_Test *this)

{
  string_view format;
  string_view format_00;
  string_view format_01;
  string_view format_02;
  bool bVar1;
  undefined1 uVar2;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  char (*in_stack_fffffffffffffde8) [9];
  undefined7 in_stack_fffffffffffffdf0;
  undefined1 in_stack_fffffffffffffdf7;
  char (*in_stack_fffffffffffffdf8) [6];
  string *expected;
  char *in_stack_fffffffffffffe00;
  Message *in_stack_fffffffffffffe08;
  int line;
  Message *in_stack_fffffffffffffe10;
  Type in_stack_fffffffffffffe1c;
  Type type;
  AssertHelper *in_stack_fffffffffffffe20;
  AssertHelper *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  string *psVar3;
  Message *in_stack_fffffffffffffe68;
  AssertHelper *in_stack_fffffffffffffe70;
  string local_178 [32];
  string local_158 [32];
  AssertionResult local_138 [3];
  AssertHelper local_108 [4];
  AssertionResult local_e8 [3];
  string local_b8 [32];
  string local_98 [32];
  AssertionResult local_78 [4];
  string local_38 [32];
  AssertionResult local_18;
  
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             *in_stack_fffffffffffffde8);
  format.data_._7_1_ = in_stack_fffffffffffffdf7;
  format.data_._0_7_ = in_stack_fffffffffffffdf0;
  format.size_ = (size_t)in_stack_fffffffffffffdf8;
  test_sprintf<char[4]>(format,(char (*) [4])in_stack_fffffffffffffde8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  std::__cxx11::string::~string(local_38);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe20);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               in_stack_fffffffffffffde8);
    testing::Message::operator<<
              ((Message *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
               (char (*) [5])in_stack_fffffffffffffde8);
    testing::AssertionResult::failure_message((AssertionResult *)0x11bd32);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,(char *)in_stack_fffffffffffffe10
               ,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    testing::Message::~Message((Message *)0x11bd8c);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11bde4);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             *in_stack_fffffffffffffde8);
  psVar3 = local_b8;
  format_01.data_._7_1_ = in_stack_fffffffffffffe37;
  format_01.data_._0_7_ = in_stack_fffffffffffffe30;
  format_01.size_ = (size_t)psVar3;
  make_positional_abi_cxx11_(format_01);
  fmt::v5::sprintf<std::__cxx11::string,char[4]>
            (in_stack_fffffffffffffe28,(char (*) [4])in_stack_fffffffffffffe20);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  std::__cxx11::string::~string(local_98);
  std::__cxx11::string::~string(local_b8);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_78);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe20);
    in_stack_fffffffffffffe28 =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         testing::AssertionResult::failure_message((AssertionResult *)0x11bf2d);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe1c,(char *)in_stack_fffffffffffffe10
               ,(int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    testing::Message::~Message((Message *)0x11bf8a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11bfe2);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             *in_stack_fffffffffffffde8);
  this_00 = local_108;
  format_00.data_._7_1_ = in_stack_fffffffffffffdf7;
  format_00.data_._0_7_ = in_stack_fffffffffffffdf0;
  format_00.size_ = (size_t)in_stack_fffffffffffffdf8;
  test_sprintf<char[4]>(format_00,(char (*) [4])in_stack_fffffffffffffde8);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  std::__cxx11::string::~string((string *)local_108);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_e8);
  type = CONCAT13(bVar1,(int3)in_stack_fffffffffffffe1c);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    in_stack_fffffffffffffe10 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                    in_stack_fffffffffffffde8);
    in_stack_fffffffffffffe08 =
         testing::Message::operator<<
                   ((Message *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
                    (char (*) [7])in_stack_fffffffffffffde8);
    in_stack_fffffffffffffe00 =
         testing::AssertionResult::failure_message((AssertionResult *)0x11c117);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffe10,
               (int)((ulong)in_stack_fffffffffffffe08 >> 0x20),in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
    testing::Message::~Message((Message *)0x11c171);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c1c9);
  fmt::v5::basic_string_view<char>::basic_string_view
            ((basic_string_view<char> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0),
             *in_stack_fffffffffffffde8);
  expected = local_178;
  format_02.data_._7_1_ = uVar2;
  format_02.data_._0_7_ = in_stack_fffffffffffffe30;
  format_02.size_ = (size_t)psVar3;
  make_positional_abi_cxx11_(format_02);
  fmt::v5::sprintf<std::__cxx11::string,char[4]>(in_stack_fffffffffffffe28,(char (*) [4])this_00);
  testing::internal::EqHelper<false>::Compare<char[6],std::__cxx11::string>
            ((char *)in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,(char (*) [6])expected,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffdf7,in_stack_fffffffffffffdf0));
  line = (int)((ulong)in_stack_fffffffffffffe08 >> 0x20);
  std::__cxx11::string::~string(local_158);
  std::__cxx11::string::~string(local_178);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_138);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)this_00);
    testing::AssertionResult::failure_message((AssertionResult *)0x11c312);
    testing::internal::AssertHelper::AssertHelper
              (this_00,type,(char *)in_stack_fffffffffffffe10,line,in_stack_fffffffffffffe00);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT17(uVar2,in_stack_fffffffffffffdf0));
    testing::Message::~Message((Message *)0x11c36d);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11c3c2);
  return;
}

Assistant:

TEST(PrintfTest, MinusFlag) {
  EXPECT_PRINTF("abc  ", "%-5s", "abc");
  EXPECT_PRINTF("abc  ", "%0--5s", "abc");
}